

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O3

void Game::tumbleTilesUpOnGameboard(GameBoard *gb)

{
  unsigned_long uVar1;
  ull uVar2;
  tile_t *ptVar3;
  ulong uVar4;
  point2D_t *pt;
  long lVar5;
  pointer ptVar6;
  uint local_b0;
  pointer local_a8;
  undefined1 local_88 [16];
  pointer local_78;
  _Head_base<0UL,_unsigned_long,_false> local_70;
  long local_60;
  unsigned_long local_58;
  vector<Game::tile_t,_std::allocator<Game::tile_t>_> local_50;
  unsigned_long local_38;
  
  std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
            (&local_50,(vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)gb);
  uVar1 = (gb->gbda).
          super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
          .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
  local_38 = uVar1;
  if (local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<Game::tile_t,_std::allocator<Game::tile_t>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_b0 = (uint)uVar1;
  if (0 < (int)local_b0) {
    local_a8 = (pointer)0x1;
    uVar4 = 0;
    do {
      lVar5 = (ulong)(local_b0 & 0x7fffffff) - 1;
      ptVar6 = local_a8;
      if (local_b0 != 1) {
        do {
          std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>::vector
                    ((vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)&local_70,
                     (vector<Game::tile_t,_std::allocator<Game::tile_t>_> *)gb);
          local_58 = (gb->gbda).
                     super__Tuple_impl<0UL,_unsigned_long,_std::vector<Game::tile_t,_std::allocator<Game::tile_t>_>_>
                     .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
          local_88._0_8_ = ptVar6;
          ptVar3 = anon_unknown_0::gameboard_data_point_t::operator()
                             ((gameboard_data_point_t *)&local_70,(gameboard_data_array_t *)local_88
                              ,pt);
          uVar2 = ptVar3->value;
          if ((void *)local_70._M_head_impl != (void *)0x0) {
            operator_delete((void *)local_70._M_head_impl,local_60 - local_70._M_head_impl);
          }
          if (uVar2 != 0) {
            local_78 = (pointer)0xffffffff;
            local_88._8_8_ = ptVar6;
            anon_unknown_0::moveOnGameboard(gb,(delta_t *)(local_88 + 8));
          }
          lVar5 = lVar5 + -1;
          ptVar6 = (pointer)((long)&ptVar6->value + 1);
        } while (lVar5 != 0);
      }
      uVar4 = uVar4 + 1;
      local_a8 = local_a8 + 0x10000000;
    } while (uVar4 != (local_b0 & 0x7fffffff));
  }
  return;
}

Assistant:

void tumbleTilesUpOnGameboard(GameBoard &gb) {
  doTumbleTilesUpOnGameboard(gb);
}